

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runner.cpp
# Opt level: O0

void __thiscall
tiger::trains::Runner::Runner
          (Runner *this,char *name,char *addr,int port,char *gameName,int playersNum)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined4 in_R9D;
  World *this_00;
  
  *in_RDI = &PTR__Runner_002d2ee0;
  in_RDI[1] = in_RSI;
  in_RDI[2] = in_RDX;
  *(undefined4 *)(in_RDI + 3) = in_ECX;
  in_RDI[4] = in_R8;
  *(undefined4 *)(in_RDI + 5) = in_R9D;
  this_00 = (World *)(in_RDI + 6);
  memset(this_00,0,0x350);
  trains::world::World::World(this_00);
  in_RDI[0x70] = 0;
  return;
}

Assistant:

Runner::Runner(const char *name, const char *addr, int port, const char *gameName, const int playersNum)
    : name(name), addr(addr), port(port), gameName(gameName), playersNum(playersNum), world(),bot(nullptr)
{

}